

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

RPCHelpMan * getnettotals(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  RPCMethodImpl fun;
  long lVar1;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined8 in_stack_fffffffffffff3e8;
  undefined8 in_stack_fffffffffffff3f0;
  undefined8 in_stack_fffffffffffff3f8;
  undefined8 in_stack_fffffffffffff400;
  _Manager_type in_stack_fffffffffffff408;
  undefined8 in_stack_fffffffffffff410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff418;
  pointer in_stack_fffffffffffff428;
  pointer pRVar2;
  pointer in_stack_fffffffffffff430;
  pointer pRVar3;
  pointer in_stack_fffffffffffff438;
  pointer pRVar4;
  undefined8 in_stack_fffffffffffff440;
  pointer pRVar5;
  pointer pRVar6;
  pointer pRVar7;
  undefined8 in_stack_fffffffffffff460;
  pointer pRVar8;
  pointer pRVar9;
  pointer pRVar10;
  undefined8 in_stack_fffffffffffff480;
  pointer pRVar11;
  pointer pRVar12;
  allocator<char> local_b5a;
  allocator<char> local_b59;
  vector<RPCResult,_std::allocator<RPCResult>_> local_b58;
  allocator<char> local_b3a;
  allocator<char> local_b39;
  vector<RPCResult,_std::allocator<RPCResult>_> local_b38;
  allocator<char> local_b1a;
  allocator<char> local_b19;
  vector<RPCResult,_std::allocator<RPCResult>_> local_b18;
  allocator<char> local_afa;
  allocator<char> local_af9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_af8;
  allocator<char> local_ad9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ad8;
  allocator<char> local_aba;
  allocator<char> local_ab9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_ab8;
  allocator<char> local_a92;
  allocator<char> local_a91;
  vector<RPCResult,_std::allocator<RPCResult>_> local_a90;
  allocator<char> local_a72;
  allocator<char> local_a71;
  RPCResults local_a70;
  vector<RPCArg,_std::allocator<RPCArg>_> local_a58;
  allocator<char> local_a32;
  allocator<char> local_a31;
  string local_a30;
  string local_a10;
  string local_9f0;
  string local_9d0;
  string local_9b0;
  string local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_970;
  char *local_950;
  size_type local_948;
  char local_940 [8];
  undefined8 uStack_938;
  string local_930 [32];
  string local_910 [32];
  string local_8f0 [32];
  string local_8d0 [32];
  string local_8b0 [32];
  string local_890 [32];
  string local_870 [32];
  string local_850 [32];
  string local_830 [32];
  string local_810 [32];
  string local_7f0 [32];
  string local_7d0 [32];
  RPCResult local_7b0 [4];
  RPCResult local_590;
  RPCResult local_508;
  string local_480 [32];
  string local_460 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  RPCResult local_360 [4];
  string local_140 [32];
  string local_120 [32];
  RPCResult local_100;
  string local_78 [32];
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_58,"getnettotals",&local_a31);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,
             "Returns information about network traffic, including bytes in, bytes out,\nand current system time."
             ,&local_a32);
  local_a58.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_a58.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_a58.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>(local_120,"",&local_a71);
  std::__cxx11::string::string<std::allocator<char>>(local_140,"",&local_a72);
  std::__cxx11::string::string<std::allocator<char>>(local_380,"totalbytesrecv",&local_a91);
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"Total bytes received",&local_a92);
  local_ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ab8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_string_length = in_stack_fffffffffffff3f0;
  m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3e8;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff3f8;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff400;
  description._M_string_length = in_stack_fffffffffffff410;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff408;
  description.field_2 = in_stack_fffffffffffff418;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff430;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff428;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff438;
  RPCResult::RPCResult(local_360,NUM,m_key_name,description,inner,SUB81(local_380,0));
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"totalbytessent",&local_ab9);
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"Total bytes sent",&local_aba);
  local_ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_ad8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_string_length = in_stack_fffffffffffff3f0;
  m_key_name_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3e8;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff3f8;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff400;
  description_00._M_string_length = in_stack_fffffffffffff410;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff408;
  description_00.field_2 = in_stack_fffffffffffff418;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff430;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff428;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff438;
  RPCResult::RPCResult(local_360 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_3c0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_400,"timemillis",&local_ad9);
  std::operator+(&local_440,"Current system ",&UNIX_EPOCH_TIME_abi_cxx11_);
  std::operator+(&local_420,&local_440," in milliseconds");
  local_af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_af8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_string_length = in_stack_fffffffffffff3f0;
  m_key_name_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3e8;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff3f8;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff400;
  description_01._M_string_length = in_stack_fffffffffffff410;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff408;
  description_01.field_2 = in_stack_fffffffffffff418;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff430;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff428;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff438;
  RPCResult::RPCResult(local_360 + 2,NUM_TIME,m_key_name_01,description_01,inner_01,false);
  std::__cxx11::string::string<std::allocator<char>>(local_460,"uploadtarget",&local_af9);
  std::__cxx11::string::string<std::allocator<char>>(local_480,"",&local_afa);
  std::__cxx11::string::string<std::allocator<char>>(local_7d0,"timeframe",&local_b19);
  std::__cxx11::string::string<std::allocator<char>>
            (local_7f0,"Length of the measuring timeframe in seconds",&local_b1a);
  local_b38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b38.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_string_length = in_stack_fffffffffffff3f0;
  m_key_name_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3e8;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_fffffffffffff3f8;
  m_key_name_02.field_2._8_8_ = in_stack_fffffffffffff400;
  description_02._M_string_length = in_stack_fffffffffffff410;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff408;
  description_02.field_2 = in_stack_fffffffffffff418;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff430;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff428;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff438;
  RPCResult::RPCResult(local_7b0,NUM,m_key_name_02,description_02,inner_02,SUB81(local_7d0,0));
  std::__cxx11::string::string<std::allocator<char>>(local_810,"target",&local_b39);
  std::__cxx11::string::string<std::allocator<char>>(local_830,"Target in bytes",&local_b3a);
  local_b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b58.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_string_length = in_stack_fffffffffffff3f0;
  m_key_name_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3e8;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_fffffffffffff3f8;
  m_key_name_03.field_2._8_8_ = in_stack_fffffffffffff400;
  description_03._M_string_length = in_stack_fffffffffffff410;
  description_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffff408;
  description_03.field_2 = in_stack_fffffffffffff418;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff430;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff428;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff438;
  RPCResult::RPCResult(local_7b0 + 1,NUM,m_key_name_03,description_03,inner_03,SUB81(local_810,0));
  std::__cxx11::string::string<std::allocator<char>>(local_850,"target_reached",&local_b59);
  std::__cxx11::string::string<std::allocator<char>>
            (local_870,"True if target is reached",&local_b5a);
  pRVar11 = (pointer)0x0;
  pRVar12 = (pointer)0x0;
  m_key_name_04._M_string_length = in_stack_fffffffffffff3f0;
  m_key_name_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3e8;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_fffffffffffff3f8;
  m_key_name_04.field_2._8_8_ = in_stack_fffffffffffff400;
  description_04._M_string_length = in_stack_fffffffffffff410;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff408;
  description_04.field_2 = in_stack_fffffffffffff418;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff430;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff428;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff438;
  RPCResult::RPCResult(local_7b0 + 2,BOOL,m_key_name_04,description_04,inner_04,SUB81(local_850,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_890,"serve_historical_blocks",(allocator<char> *)&stack0xfffffffffffff487);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8b0,"True if serving historical blocks",
             (allocator<char> *)&stack0xfffffffffffff486);
  pRVar8 = (pointer)0x0;
  pRVar9 = (pointer)0x0;
  pRVar10 = (pointer)0x0;
  m_key_name_05._M_string_length = in_stack_fffffffffffff3f0;
  m_key_name_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3e8;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_fffffffffffff3f8;
  m_key_name_05.field_2._8_8_ = in_stack_fffffffffffff400;
  description_05._M_string_length = in_stack_fffffffffffff410;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff408;
  description_05.field_2 = in_stack_fffffffffffff418;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff430;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff428;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff438;
  RPCResult::RPCResult(local_7b0 + 3,BOOL,m_key_name_05,description_05,inner_05,SUB81(local_890,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_8d0,"bytes_left_in_cycle",(allocator<char> *)&stack0xfffffffffffff467);
  std::__cxx11::string::string<std::allocator<char>>
            (local_8f0,"Bytes left in current time cycle",
             (allocator<char> *)&stack0xfffffffffffff466);
  pRVar5 = (pointer)0x0;
  pRVar6 = (pointer)0x0;
  pRVar7 = (pointer)0x0;
  m_key_name_06._M_string_length = in_stack_fffffffffffff3f0;
  m_key_name_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3e8;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_fffffffffffff3f8;
  m_key_name_06.field_2._8_8_ = in_stack_fffffffffffff400;
  description_06._M_string_length = in_stack_fffffffffffff410;
  description_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffff408;
  description_06.field_2 = in_stack_fffffffffffff418;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff430;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff428;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff438;
  RPCResult::RPCResult(&local_590,NUM,m_key_name_06,description_06,inner_06,SUB81(local_8d0,0));
  std::__cxx11::string::string<std::allocator<char>>
            (local_910,"time_left_in_cycle",(allocator<char> *)&stack0xfffffffffffff447);
  std::__cxx11::string::string<std::allocator<char>>
            (local_930,"Seconds left in current time cycle",
             (allocator<char> *)&stack0xfffffffffffff446);
  pRVar2 = (pointer)0x0;
  pRVar3 = (pointer)0x0;
  pRVar4 = (pointer)0x0;
  m_key_name_07._M_string_length = in_stack_fffffffffffff3f0;
  m_key_name_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3e8;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_fffffffffffff3f8;
  m_key_name_07.field_2._8_8_ = in_stack_fffffffffffff400;
  description_07._M_string_length = in_stack_fffffffffffff410;
  description_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffff408;
  description_07.field_2._M_local_buf = in_stack_fffffffffffff418._M_local_buf;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  RPCResult::RPCResult(&local_508,NUM,m_key_name_07,description_07,inner_07,SUB81(local_910,0));
  __l._M_len = 6;
  __l._M_array = local_7b0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_b18,__l,(allocator_type *)&stack0xfffffffffffff427);
  m_key_name_08._M_string_length = in_stack_fffffffffffff3f0;
  m_key_name_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3e8;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_fffffffffffff3f8;
  m_key_name_08.field_2._8_8_ = in_stack_fffffffffffff400;
  description_08._M_string_length = in_stack_fffffffffffff410;
  description_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffff408;
  description_08.field_2._M_local_buf = in_stack_fffffffffffff418._M_local_buf;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(local_360 + 3,OBJ,m_key_name_08,description_08,inner_08,SUB81(local_460,0));
  __l_00._M_len = 4;
  __l_00._M_array = local_360;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_a90,__l_00,(allocator_type *)&stack0xfffffffffffff426);
  m_key_name_09._M_string_length = in_stack_fffffffffffff3f0;
  m_key_name_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3e8;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_fffffffffffff3f8;
  m_key_name_09.field_2._8_8_ = in_stack_fffffffffffff400;
  description_09._M_string_length = in_stack_fffffffffffff410;
  description_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffff408;
  description_09.field_2 = in_stack_fffffffffffff418;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar3;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar2;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar4;
  RPCResult::RPCResult(&local_100,OBJ,m_key_name_09,description_09,inner_09,SUB81(local_120,0));
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_fffffffffffff3f0;
  result._0_8_ = in_stack_fffffffffffff3e8;
  result.m_key_name._M_string_length = in_stack_fffffffffffff3f8;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff400;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff408;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff410;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff418;
  result._64_8_ = pRVar2;
  result.m_description._M_dataplus._M_p = (pointer)pRVar3;
  result.m_description._M_string_length = (size_type)pRVar4;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff440;
  result.m_description.field_2._8_8_ = pRVar5;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar6;
  result.m_cond._M_string_length = (size_type)pRVar7;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff460;
  result.m_cond.field_2._8_8_ = pRVar8;
  RPCResults::RPCResults(&local_a70,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9b0,"getnettotals",(allocator<char> *)&stack0xfffffffffffff425);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_9d0,"",(allocator<char> *)&stack0xfffffffffffff424);
  HelpExampleCli(&local_990,&local_9b0,&local_9d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a10,"getnettotals",(allocator<char> *)&stack0xfffffffffffff423);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a30,"",(allocator<char> *)&stack0xfffffffffffff422);
  HelpExampleRpc(&local_9f0,&local_a10,&local_a30);
  std::operator+(&local_970,&local_990,&local_9f0);
  local_950 = local_940;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970._M_dataplus._M_p == &local_970.field_2) {
    uStack_938 = local_970.field_2._8_8_;
  }
  else {
    local_950 = local_970._M_dataplus._M_p;
  }
  local_948 = local_970._M_string_length;
  local_970._M_string_length = 0;
  local_970.field_2._M_local_buf[0] = '\0';
  description_10._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:576:9)>
       ::_M_invoke;
  description_10._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/net.cpp:576:9)>
                ::_M_manager;
  description_10.field_2 = in_stack_fffffffffffff418;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar3;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar2;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar4;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar5;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff440;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar6;
  examples.m_examples._M_string_length = in_stack_fffffffffffff460;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar7;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar8;
  examples.m_examples.field_2._8_8_ = pRVar9;
  fun.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffff480;
  fun.super__Function_base._M_functor._M_unused._M_object = pRVar10;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar11;
  fun._M_invoker = (_Invoker_type)pRVar12;
  local_970._M_dataplus._M_p = (pointer)&local_970.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_fffffffffffff3f0,&stack0xfffffffffffff3f8)),
             description_10,args,results,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffff3f8);
  std::__cxx11::string::~string((string *)&local_950);
  std::__cxx11::string::~string((string *)&local_970);
  std::__cxx11::string::~string((string *)&local_9f0);
  std::__cxx11::string::~string((string *)&local_a30);
  std::__cxx11::string::~string((string *)&local_a10);
  std::__cxx11::string::~string((string *)&local_990);
  std::__cxx11::string::~string((string *)&local_9d0);
  std::__cxx11::string::~string((string *)&local_9b0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a70.m_results);
  RPCResult::~RPCResult(&local_100);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_a90);
  lVar1 = 0x198;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_360[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b18);
  lVar1 = 0x2a8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_7b0[0].m_type + lVar1));
    lVar1 = lVar1 + -0x88;
  } while (lVar1 != -0x88);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff428);
  std::__cxx11::string::~string(local_930);
  std::__cxx11::string::~string(local_910);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff448);
  std::__cxx11::string::~string(local_8f0);
  std::__cxx11::string::~string(local_8d0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff468);
  std::__cxx11::string::~string(local_8b0);
  std::__cxx11::string::~string(local_890);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff488);
  std::__cxx11::string::~string(local_870);
  std::__cxx11::string::~string(local_850);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b58);
  std::__cxx11::string::~string(local_830);
  std::__cxx11::string::~string(local_810);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_b38);
  std::__cxx11::string::~string(local_7f0);
  std::__cxx11::string::~string(local_7d0);
  std::__cxx11::string::~string(local_480);
  std::__cxx11::string::~string(local_460);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_af8);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string(local_400);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ad8);
  std::__cxx11::string::~string(local_3e0);
  std::__cxx11::string::~string(local_3c0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_ab8);
  std::__cxx11::string::~string(local_3a0);
  std::__cxx11::string::~string(local_380);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_120);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_a58);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getnettotals()
{
    return RPCHelpMan{"getnettotals",
        "Returns information about network traffic, including bytes in, bytes out,\n"
        "and current system time.",
        {},
                RPCResult{
                   RPCResult::Type::OBJ, "", "",
                   {
                       {RPCResult::Type::NUM, "totalbytesrecv", "Total bytes received"},
                       {RPCResult::Type::NUM, "totalbytessent", "Total bytes sent"},
                       {RPCResult::Type::NUM_TIME, "timemillis", "Current system " + UNIX_EPOCH_TIME + " in milliseconds"},
                       {RPCResult::Type::OBJ, "uploadtarget", "",
                       {
                           {RPCResult::Type::NUM, "timeframe", "Length of the measuring timeframe in seconds"},
                           {RPCResult::Type::NUM, "target", "Target in bytes"},
                           {RPCResult::Type::BOOL, "target_reached", "True if target is reached"},
                           {RPCResult::Type::BOOL, "serve_historical_blocks", "True if serving historical blocks"},
                           {RPCResult::Type::NUM, "bytes_left_in_cycle", "Bytes left in current time cycle"},
                           {RPCResult::Type::NUM, "time_left_in_cycle", "Seconds left in current time cycle"},
                        }},
                    }
                },
                RPCExamples{
                    HelpExampleCli("getnettotals", "")
            + HelpExampleRpc("getnettotals", "")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    const CConnman& connman = EnsureConnman(node);

    UniValue obj(UniValue::VOBJ);
    obj.pushKV("totalbytesrecv", connman.GetTotalBytesRecv());
    obj.pushKV("totalbytessent", connman.GetTotalBytesSent());
    obj.pushKV("timemillis", TicksSinceEpoch<std::chrono::milliseconds>(SystemClock::now()));

    UniValue outboundLimit(UniValue::VOBJ);
    outboundLimit.pushKV("timeframe", count_seconds(connman.GetMaxOutboundTimeframe()));
    outboundLimit.pushKV("target", connman.GetMaxOutboundTarget());
    outboundLimit.pushKV("target_reached", connman.OutboundTargetReached(false));
    outboundLimit.pushKV("serve_historical_blocks", !connman.OutboundTargetReached(true));
    outboundLimit.pushKV("bytes_left_in_cycle", connman.GetOutboundTargetBytesLeft());
    outboundLimit.pushKV("time_left_in_cycle", count_seconds(connman.GetMaxOutboundTimeLeftInCycle()));
    obj.pushKV("uploadtarget", std::move(outboundLimit));
    return obj;
},
    };
}